

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGNodeMatchesList(xmlNodePtr node,xmlRelaxNGDefinePtr_conflict *list)

{
  xmlRelaxNGDefinePtr_conflict define;
  int iVar1;
  uint uVar2;
  
  if (list != (xmlRelaxNGDefinePtr_conflict *)0x0) {
    for (; define = *list, define != (xmlRelaxNGDefinePtr_conflict)0x0; list = list + 1) {
      if (node->type == XML_ELEMENT_NODE) {
        if ((define->type == XML_RELAXNG_ELEMENT) &&
           (iVar1 = xmlRelaxNGElementMatch((xmlRelaxNGValidCtxtPtr)0x0,define,node), iVar1 == 1)) {
          return 1;
        }
      }
      else if (((node->type - XML_TEXT_NODE < 2) &&
               (uVar2 = define->type + ~XML_RELAXNG_EXCEPT, uVar2 < 6)) &&
              ((0x35U >> (uVar2 & 0x1f) & 1) != 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlRelaxNGNodeMatchesList(xmlNodePtr node, xmlRelaxNGDefinePtr * list)
{
    xmlRelaxNGDefinePtr cur;
    int i = 0, tmp;

    if ((node == NULL) || (list == NULL))
        return (0);

    cur = list[i++];
    while (cur != NULL) {
        if ((node->type == XML_ELEMENT_NODE) &&
            (cur->type == XML_RELAXNG_ELEMENT)) {
            tmp = xmlRelaxNGElementMatch(NULL, cur, node);
            if (tmp == 1)
                return (1);
        } else if (((node->type == XML_TEXT_NODE) ||
                    (node->type == XML_CDATA_SECTION_NODE)) &&
                   ((cur->type == XML_RELAXNG_DATATYPE) ||
		    (cur->type == XML_RELAXNG_LIST) ||
                    (cur->type == XML_RELAXNG_TEXT) ||
                    (cur->type == XML_RELAXNG_VALUE))) {
            return (1);
        }
        cur = list[i++];
    }
    return (0);
}